

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteUnary(ZCCCompiler *this,EZCCExprType op,ZCC_Expression **expr)

{
  PType *pPVar1;
  ZCC_OpProto *proto;
  int routelen;
  Conversion *route [8];
  ZCC_Expression **expr_local;
  EZCCExprType op_local;
  ZCCCompiler *this_local;
  
  if ((*expr)->Type == &TypeError->super_PType) {
    this_local = (ZCCCompiler *)0x0;
  }
  else {
    proto._4_4_ = 8;
    route[7] = (Conversion *)expr;
    this_local = (ZCCCompiler *)
                 ZCC_OpInfoType::FindBestProto
                           (ZCC_OpInfo + op,(*expr)->Type,(Conversion **)&stack0xffffffffffffff98,
                            (int *)((long)&proto + 4));
    if (this_local != (ZCCCompiler *)0x0) {
      pPVar1 = (PType *)ApplyConversion(this,(ZCC_Expression *)route[7]->TargetType,
                                        (Conversion **)&stack0xffffffffffffff98,proto._4_4_);
      route[7]->TargetType = pPVar1;
    }
  }
  return (ZCC_OpProto *)this_local;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteUnary(EZCCExprType op, ZCC_Expression *&expr)
{
	if (expr->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
	int routelen = countof(route);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(expr->Type, route, routelen);

	if (proto != NULL)
	{
		expr = ApplyConversion(expr, route, routelen);
	}
	return proto;
}